

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O0

int connection_error(rtr_mgr_status status)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_11c;
  rtr_mgr_status status_local;
  char input [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (status == RTR_MGR_ERROR) {
    fgets((char *)&status_local,0x100,_stdin);
    printf("error\n");
    fflush(_stdout);
  }
  local_11c = (uint)(status == RTR_MGR_ERROR);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11c;
}

Assistant:

static int connection_error(enum rtr_mgr_status status)
{
	if (status == RTR_MGR_ERROR) {
		/*
		 * Wait for input before printing error to avoid "broken pipe" error
		 * while communicating with the Python program.
		 */
		char input[256];

		if (fgets(input, 256, stdin))
			;
		printf("error\n");
		fflush(stdout);
		return 1;
	}
	return 0;
}